

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void CVmObjList::set_index_list(vm_val_t *result,char *lst,vm_val_t *index_val,vm_val_t *new_val)

{
  uint uVar1;
  vm_obj_id_t obj_00;
  size_t sVar2;
  vm_val_t *in_RCX;
  vm_val_t *in_RDI;
  CVmObjList *obj;
  uint32_t idx;
  char *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc0;
  
  uVar1 = vm_val_t::num_to_int(in_stack_ffffffffffffffc0);
  CVmStack::push(in_RCX);
  if (uVar1 != 0) {
    sVar2 = vmb_get_len((char *)0x31b6ea);
    if (uVar1 <= sVar2) {
      obj_00 = create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
      vm_val_t::set_obj(in_RDI,obj_00);
      vm_objp(0);
      cons_set_element((CVmObjList *)in_RDI,(size_t)in_stack_ffffffffffffffb8,(vm_val_t *)0x31b74f);
      CVmStack::discard();
      return;
    }
  }
  err_throw(0);
}

Assistant:

void CVmObjList::set_index_list(VMG_ vm_val_t *result, const char *lst,
                                const vm_val_t *index_val,
                                const vm_val_t *new_val)
{
    /* get the index value as an integer */
    uint32_t idx = index_val->num_to_int(vmg0_);

    /* push the new value for gc protection during the create */
    G_stk->push(new_val);

    /* make sure it's in range - 1 to our element count, inclusive */
    if (idx < 1 || idx > vmb_get_len(lst))
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* create a new list as a copy of this list */
    result->set_obj(create(vmg_ FALSE, lst));

    /* get the new list object */
    CVmObjList *obj = (CVmObjList *)vm_objp(vmg_ result->val.obj);

    /* update the element of the new list */
    obj->cons_set_element(idx - 1, new_val);

    /* discard our gc protection */
    G_stk->discard();
}